

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vta_ManCollectNodes_rec(Vta_Man_t *p,Vta_Obj_t *pThis,Vec_Int_t *vOrder)

{
  int Entry;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *pThis0;
  Vta_Obj_t *local_30;
  Vta_Obj_t *local_28;
  
  if (-1 < (int)*(uint *)&pThis->field_0xc) {
    *(uint *)&pThis->field_0xc = *(uint *)&pThis->field_0xc | 0x80000000;
    pObj = Gia_ManObj(p->pGia,pThis->iObj);
    if ((pThis->field_0xf & 0x40) != 0) {
      Vta_ObjPreds(p,pThis,pObj,&local_28,&local_30);
      if (local_28 != (Vta_Obj_t *)0x0) {
        Vta_ManCollectNodes_rec(p,local_28,vOrder);
      }
      if (local_30 != (Vta_Obj_t *)0x0) {
        Vta_ManCollectNodes_rec(p,local_30,vOrder);
      }
    }
    Entry = Vta_ObjId(p,pThis);
    Vec_IntPush(vOrder,Entry);
    return;
  }
  return;
}

Assistant:

void Vta_ManCollectNodes_rec( Vta_Man_t * p, Vta_Obj_t * pThis, Vec_Int_t * vOrder )
{
    Gia_Obj_t * pObj;
    Vta_Obj_t * pThis0, * pThis1;
    if ( pThis->fVisit )
        return;
    pThis->fVisit = 1;
    pObj = Gia_ManObj( p->pGia, pThis->iObj );
    if ( pThis->fAdded )
    {
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) Vta_ManCollectNodes_rec( p, pThis0, vOrder );
        if ( pThis1 ) Vta_ManCollectNodes_rec( p, pThis1, vOrder );
    }
    Vec_IntPush( vOrder, Vta_ObjId(p, pThis) );
}